

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::MarkOrCopyLine(FlowBuffer *this)

{
  uint8 uVar1;
  LineBreakStyle LVar2;
  anon_enum_32 aVar3;
  long lVar4;
  int iVar5;
  const_byteptr puVar6;
  anon_enum_32 aVar7;
  const_byteptr puVar8;
  
  LVar2 = this->linebreak_style_;
  if (LVar2 == LINE_BREAKER) {
    puVar6 = this->orig_data_begin_;
    if ((puVar6 != (const_byteptr)0x0) &&
       (puVar8 = this->orig_data_end_, puVar8 != (const_byteptr)0x0)) {
      lVar4 = 0;
      while( true ) {
        if (puVar8 <= puVar6 + lVar4) {
          AppendToBuffer(this,puVar6,(int)puVar8 - (int)puVar6);
          return;
        }
        if (puVar6[lVar4] == this->linebreaker_) break;
        lVar4 = lVar4 + 1;
      }
      if (this->buffer_n_ == 0) {
        this->frame_length_ = (int)lVar4;
      }
      else {
        AppendToBuffer(this,puVar6,(int)lVar4 + 1);
        this->buffer_n_ = this->buffer_n_ + -1;
      }
      this->message_complete_ = true;
    }
    return;
  }
  if (LVar2 == STRICT_CRLF) {
    puVar6 = this->orig_data_begin_;
    aVar7 = this->state_;
    iVar5 = -1;
    puVar8 = puVar6;
    do {
      if (this->orig_data_end_ <= puVar8) {
        AppendToBuffer(this,puVar6,(int)this->orig_data_end_ - (int)puVar6);
        return;
      }
      aVar3 = STRICT_CRLF_1;
      if (*puVar8 == '\r') {
LAB_0010294b:
        aVar7 = aVar3;
        this->state_ = aVar7;
      }
      else {
        if (*puVar8 != '\n') {
          aVar3 = FRAME_MODE;
          goto LAB_0010294b;
        }
        if (aVar7 == STRICT_CRLF_1) {
          this->state_ = FRAME_MODE;
          if (this->buffer_n_ == 0) {
            this->frame_length_ = iVar5;
          }
          else {
            AppendToBuffer(this,puVar6,iVar5 + 2);
            this->buffer_n_ = this->buffer_n_ + -2;
          }
          this->message_complete_ = true;
          return;
        }
      }
      puVar8 = puVar8 + 1;
      iVar5 = iVar5 + 1;
    } while( true );
  }
  if (LVar2 != CR_OR_LF) {
    return;
  }
  puVar6 = this->orig_data_begin_;
  if ((puVar6 != (const_byteptr)0x0) &&
     (puVar8 = this->orig_data_end_, puVar8 != (const_byteptr)0x0)) {
    if ((puVar6 < puVar8) && ((this->state_ == CR_OR_LF_1 && (*puVar6 == '\n')))) {
      this->state_ = CR_OR_LF_0;
      puVar6 = puVar6 + 1;
      this->orig_data_begin_ = puVar6;
    }
    lVar4 = 0;
    while( true ) {
      if (puVar8 <= puVar6 + lVar4) {
        AppendToBuffer(this,puVar6,(int)puVar8 - (int)puVar6);
        return;
      }
      uVar1 = puVar6[lVar4];
      if (uVar1 == '\n') break;
      if (uVar1 == '\r') {
        this->state_ = CR_OR_LF_1;
        break;
      }
      lVar4 = lVar4 + 1;
    }
    if (this->buffer_n_ == 0) {
      this->frame_length_ = (int)lVar4;
    }
    else {
      AppendToBuffer(this,puVar6,(int)lVar4 + 1);
      this->buffer_n_ = this->buffer_n_ + -1;
    }
    this->message_complete_ = true;
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			MarkOrCopyLine_CR_OR_LF();
			break;
		case STRICT_CRLF:
			MarkOrCopyLine_STRICT_CRLF();
			break;
		case LINE_BREAKER:
			MarkOrCopyLine_LINEBREAK();
			break;
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}